

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::NegateFloatingPointConstant
                   (ConstantManager *const_mgr,Constant *c)

{
  double dVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c_00;
  Instruction *this;
  float fVar4;
  FloatProxy<float> result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  FloatProxy<double> local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  if (c == (Constant *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xd1,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  iVar2 = (*c->type_->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*c->type_->_vptr_Type[0xc])();
    iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x24);
    if ((iVar2 != 0x20) && (iVar2 != 0x40)) {
      __assert_fail("width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0xd4,
                    "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
                   );
    }
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (iVar2 == 0x40) {
      dVar1 = analysis::Constant::GetDouble(c);
      local_50.data_ = (uint_type)-dVar1;
      utils::FloatProxy<double>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&local_50);
    }
    else {
      fVar4 = analysis::Constant::GetFloat(c);
      local_50.data_ = CONCAT44(local_50.data_._4_4_,fVar4) ^ 0x80000000;
      utils::FloatProxy<float>::GetWords
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
                 (FloatProxy<float> *)&local_50);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_30);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
    c_00 = analysis::ConstantManager::GetConstant
                     (const_mgr,c->type_,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c_00,0,(inst_iterator *)0x0);
    uVar3 = Instruction::result_id(this);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    return uVar3;
  }
  __assert_fail("c->type()->AsFloat()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xd2,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateFloatingPointConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateFloatingPointConstant(analysis::ConstantManager* const_mgr,
                                     const analysis::Constant* c) {
  assert(c);
  assert(c->type()->AsFloat());
  uint32_t width = c->type()->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
  if (width == 64) {
    utils::FloatProxy<double> result(c->GetDouble() * -1.0);
    words = result.GetWords();
  } else {
    utils::FloatProxy<float> result(c->GetFloat() * -1.0f);
    words = result.GetWords();
  }

  const analysis::Constant* negated_const =
      const_mgr->GetConstant(c->type(), std::move(words));
  return const_mgr->GetDefiningInstruction(negated_const)->result_id();
}